

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cones.h
# Opt level: O3

bool __thiscall
mp::
Convert1QC<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::ProceedQCWithTraits
          (Convert1QC<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,QuadAndLinTerms *body,int sens,double rhs,QPTermsTraits *qptt)

{
  double *pdVar1;
  int iVar2;
  size_ty sVar3;
  byte bVar4;
  bool bVar5;
  LinTerms *lint;
  QuadTerms *qpterms;
  int iVar6;
  double dVar7;
  
  qpterms = &body->super_QuadTerms;
  iVar2 = qptt->nDiffVars;
  sVar3 = (body->super_LinTerms).coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_size;
  if (iVar2 == 0 && sVar3 == 0) {
    dVar7 = (double)sens * rhs;
    iVar2 = qptt->nSamePos;
    if ((iVar2 != 1 || sens < 1) || dVar7 < 0.0) {
      iVar6 = qptt->nSameNeg;
      if ((iVar6 != 1 || -1 < sens) || dVar7 < 0.0) {
        bVar4 = (byte)((uint)sens >> 0x1f);
      }
      else {
        iVar6 = qptt->iSameNeg;
        if (0.0 <= (((this->
                     super_MCKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                     ).mc_)->
                   super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                   ).super_FlatModel<mp::DefaultFlatModelParams>.var_lb_.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start
                   [(qpterms->folded_).
                    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                    .m_data.
                    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                    .m_data_ptr[iVar6].first.first]) goto LAB_00422d97;
        bVar4 = 1;
        iVar6 = 1;
      }
    }
    else {
      iVar6 = qptt->iSamePos;
      if (0.0 <= (((this->
                   super_MCKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                   ).mc_)->
                 super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                 ).super_FlatModel<mp::DefaultFlatModelParams>.var_lb_.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[(qpterms->folded_).
                           super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                           .m_data.
                           super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                           .m_data_ptr[iVar6].first.first]) {
LAB_00422d97:
        bVar5 = AddStandardQC(this,qpterms,iVar6,0.0,rhs);
        return bVar5;
      }
      iVar6 = qptt->nSameNeg;
      bVar4 = 0;
    }
    if (((iVar6 != 0 && (iVar2 == 0 && 0 < sens)) && dVar7 <= 0.0) ||
       (((bVar4 == 1 && iVar6 == 0) && iVar2 != 0) && dVar7 <= 0.0)) {
      bVar5 = AddStandardQC(this,qpterms,-1,rhs,0.0);
      return bVar5;
    }
  }
  else if ((((((iVar2 == 1) != (sVar3 == 1)) && (dVar7 = (double)sens, 0.0 <= dVar7 * rhs)) &&
            ((sVar3 != 1 ||
             ((pdVar1 = (((this->
                          super_MCKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                          ).mc_)->
                        super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                        ).super_FlatModel<mp::DefaultFlatModelParams>.var_lb_.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start +
                        *(body->super_LinTerms).vars_.
                         super_small_vector_base<std::allocator<int>,_6U>.m_data.
                         super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
              0.0 < *pdVar1 || *pdVar1 == 0.0 &&
              (0.0 <= *(body->super_LinTerms).coefs_.
                       super_small_vector_base<std::allocator<double>,_6U>.m_data.
                       super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr * dVar7)))))
            ) && ((iVar2 != 1 || (0.0 <= dVar7 * qptt->coef12)))) &&
          (((0 < sens && (qptt->nSamePos == 0)) || ((sens < 0 && (qptt->nSameNeg == 0)))))) {
    bVar5 = AddRotatedQC(this,qpterms,&body->super_LinTerms,rhs,qptt->iDiffVars);
    return bVar5;
  }
  return false;
}

Assistant:

bool ProceedQCWithTraits(const QuadAndLinTerms& body,
                           int sens, double rhs,
                           const QPTermsTraits& qptt) {
    const auto& lint = body.GetLinTerms();
    assert(lint.size() <= 1);
    assert(qptt.nDiffVars <= 1);
    const auto& qpterms = body.GetQPTerms();
    if (qptt.nDiffVars || lint.size()) {       // Rotated cone?
      const auto fLT1 = lint.size()==1;        // Constant in the lhs?
      const auto fND1 = qptt.nDiffVars==1;
      if (fLT1 + fND1 == 1 &&
          rhs * sens >= 0.0) {                 // ... >= ... + rhs
        if (fLT1 &&                            // Check lin term
            (MC().lb( lint.var(0) ) < 0.0 ||
             lint.coef(0)*sens < 0.0))
          return false;
        if (fND1 && qptt.coef12*sens<0.0)
          return false;
        if ((sens>0 &&
             qptt.nSamePos==0)
            ||
            (sens<0 &&
             qptt.nSameNeg==0))
          return AddRotatedQC(qpterms, lint, rhs,
                              qptt.iDiffVars);
      }
    } else {                          // Standard cone?
      if (0.0 <= rhs*sens &&          // It's x^2 >= ||y^2|| + |rhs|
          sens>0 && qptt.nSamePos==1 &&
          MC().lb(qpterms.var1(qptt.iSamePos))>=0.0)
        return AddStandardQC(qpterms, qptt.iSamePos, 0.0, rhs);
      if (0.0 <= rhs*sens &&
          sens<0 && qptt.nSameNeg==1 &&
          MC().lb(qpterms.var1(qptt.iSameNeg))>=0.0)
        return AddStandardQC(qpterms, qptt.iSameNeg, 0.0, rhs);
      if (0.0 >= rhs*sens &&          // |rhs| >= ||y^2||
          sens>0 && qptt.nSamePos==0 && qptt.nSameNeg)
        return AddStandardQC(qpterms, -1, rhs);
      if (0.0 >= rhs*sens &&
          sens<0 && qptt.nSameNeg==0 && qptt.nSamePos)
        return AddStandardQC(qpterms, -1, rhs);
    }
    return false;
  }